

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mm_serial.c
# Opt level: O0

mm_serial_context_t * open_serial(char *modem_dev,FILE *logstream,FILE *bytestream)

{
  mm_serial_context_t *pmVar1;
  mm_serial_context_t *pserial_context;
  int fd;
  FILE *bytestream_local;
  FILE *logstream_local;
  char *modem_dev_local;
  
  pserial_context._4_4_ = -1;
  if (bytestream == (FILE *)0x0) {
    pserial_context._4_4_ = platform_open_serial(modem_dev);
  }
  pmVar1 = (mm_serial_context_t *)calloc(1,0x18);
  if (pmVar1 == (mm_serial_context_t *)0x0) {
    fprintf(_stderr,"%s: Error allocating memory.\n","open_serial");
    exit(-0xc);
  }
  pmVar1->fd = pserial_context._4_4_;
  pmVar1->logstream = logstream;
  pmVar1->bytestream = bytestream;
  return pmVar1;
}

Assistant:

mm_serial_context_t* open_serial(const char *modem_dev, FILE *logstream, FILE *bytestream) {
    int fd = -1;
    mm_serial_context_t *pserial_context;

    if (bytestream == NULL) {
        fd = platform_open_serial(modem_dev);
    }

    pserial_context = (mm_serial_context_t *)calloc(1, sizeof(mm_serial_context_t));

    if (pserial_context == NULL) {
        fprintf(stderr, "%s: Error allocating memory.\n", __func__);
        exit(-ENOMEM);
    }

    pserial_context->fd = fd;
    pserial_context->logstream  = logstream;
    pserial_context->bytestream = bytestream;

    return pserial_context;
}